

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGenWorkItem.h
# Opt level: O1

void __thiscall CodeGenWorkItem::VerifyJitMode(CodeGenWorkItem *this)

{
  FunctionBody *pFVar1;
  code *pcVar2;
  bool bVar3;
  uint sourceContextId;
  undefined4 *puVar4;
  
  if (1 < (byte)((this->jitData).jitMode - 3U)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/CodeGenWorkItem.h"
                       ,0x9f,
                       "(GetJitMode() == ExecutionMode::SimpleJit || GetJitMode() == ExecutionMode::FullJit)"
                       ,
                       "GetJitMode() == ExecutionMode::SimpleJit || GetJitMode() == ExecutionMode::FullJit"
                      );
    if (!bVar3) goto LAB_004073a4;
    *puVar4 = 0;
  }
  if ((this->jitData).jitMode == '\x03') {
    bVar3 = Js::FunctionBody::DoSimpleJit(this->functionBody);
    if (!bVar3) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar4 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/CodeGenWorkItem.h"
                         ,0xa0,
                         "(GetJitMode() != ExecutionMode::SimpleJit || GetFunctionBody()->DoSimpleJit())"
                         ,
                         "GetJitMode() != ExecutionMode::SimpleJit || GetFunctionBody()->DoSimpleJit()"
                        );
      if (!bVar3) goto LAB_004073a4;
      *puVar4 = 0;
    }
  }
  if ((this->jitData).jitMode == '\x04') {
    sourceContextId = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)this->functionBody);
    pFVar1 = this->functionBody;
    if ((pFVar1->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr ==
        (FunctionInfo *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar4 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/../Runtime/Base/FunctionBody.h"
                         ,0x4c1,"(GetFunctionInfo())","GetFunctionInfo()");
      if (!bVar3) goto LAB_004073a4;
      *puVar4 = 0;
    }
    bVar3 = Js::Phases::IsEnabled
                      ((Phases *)&DAT_015bbe90,FullJitPhase,sourceContextId,
                       ((pFVar1->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr)
                       ->functionId);
    if (bVar3) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar4 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/CodeGenWorkItem.h"
                         ,0xa1,
                         "(GetJitMode() != ExecutionMode::FullJit || !Js::Configuration::Global.flags.Off.IsEnabled(((Js::FullJitPhase)), ((GetFunctionBody())->GetSourceContextId()), ((GetFunctionBody())->GetLocalFunctionId())))"
                         ,
                         "GetJitMode() != ExecutionMode::FullJit || !PHASE_OFF(Js::FullJitPhase, GetFunctionBody())"
                        );
      if (!bVar3) {
LAB_004073a4:
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar4 = 0;
    }
  }
  return;
}

Assistant:

void VerifyJitMode() const
    {
        Assert(GetJitMode() == ExecutionMode::SimpleJit || GetJitMode() == ExecutionMode::FullJit);
        Assert(GetJitMode() != ExecutionMode::SimpleJit || GetFunctionBody()->DoSimpleJit());
        Assert(GetJitMode() != ExecutionMode::FullJit || !PHASE_OFF(Js::FullJitPhase, GetFunctionBody()));
    }